

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTruth.c
# Opt level: O0

void Map_MappingTruths(Map_Man_t *pMan)

{
  int nItemsTotal;
  Map_Node_t *p;
  int iVar1;
  ProgressBar *p_00;
  int local_30;
  int i;
  int nNodes;
  Map_Cut_t *pCut;
  Map_Node_t *pNode;
  ProgressBar *pProgress;
  Map_Man_t *pMan_local;
  
  nItemsTotal = pMan->vMapObjs->nSize;
  p_00 = Extra_ProgressBarStart(_stdout,nItemsTotal);
  local_30 = 0;
  do {
    if (nItemsTotal <= local_30) {
      Extra_ProgressBarStop(p_00);
      return;
    }
    p = pMan->vMapObjs->pArray[local_30];
    iVar1 = Map_NodeIsAnd(p);
    if (iVar1 != 0) {
      if (p->pCuts == (Map_Cut_t *)0x0) {
        __assert_fail("pNode->pCuts",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTruth.c"
                      ,0x3d,"void Map_MappingTruths(Map_Man_t *)");
      }
      if (p->pCuts->nLeaves != '\x01') {
        __assert_fail("pNode->pCuts->nLeaves == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperTruth.c"
                      ,0x3e,"void Map_MappingTruths(Map_Man_t *)");
      }
      p->pCuts->M[0].uPhase = 0;
      p->pCuts->M[0].pSupers = pMan->pSuperLib->pSuperInv;
      p->pCuts->M[0].uPhaseBest = 0;
      p->pCuts->M[0].pSuperBest = pMan->pSuperLib->pSuperInv;
      p->pCuts->M[1].uPhase = 0;
      p->pCuts->M[1].pSupers = pMan->pSuperLib->pSuperInv;
      p->pCuts->M[1].uPhaseBest = 1;
      p->pCuts->M[1].pSuperBest = pMan->pSuperLib->pSuperInv;
      for (_i = p->pCuts->pNext; _i != (Map_Cut_t *)0x0; _i = _i->pNext) {
        Map_TruthsCut(pMan,_i);
      }
      Extra_ProgressBarUpdate(p_00,local_30,"Tables ...");
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

void Map_MappingTruths( Map_Man_t * pMan )
{
    ProgressBar * pProgress;
    Map_Node_t * pNode;
    Map_Cut_t * pCut;
    int nNodes, i;
    // compute the cuts for the POs
    nNodes = pMan->vMapObjs->nSize;
    pProgress = Extra_ProgressBarStart( stdout, nNodes );
    for ( i = 0; i < nNodes; i++ )
    {
        pNode = pMan->vMapObjs->pArray[i];
        if ( !Map_NodeIsAnd( pNode ) )
            continue;
        assert( pNode->pCuts );
        assert( pNode->pCuts->nLeaves == 1 );

        // match the simple cut
        pNode->pCuts->M[0].uPhase     = 0;
        pNode->pCuts->M[0].pSupers    = pMan->pSuperLib->pSuperInv;
        pNode->pCuts->M[0].uPhaseBest = 0;
        pNode->pCuts->M[0].pSuperBest = pMan->pSuperLib->pSuperInv;

        pNode->pCuts->M[1].uPhase     = 0;
        pNode->pCuts->M[1].pSupers    = pMan->pSuperLib->pSuperInv;
        pNode->pCuts->M[1].uPhaseBest = 1;
        pNode->pCuts->M[1].pSuperBest = pMan->pSuperLib->pSuperInv;

        // match the rest of the cuts
        for ( pCut = pNode->pCuts->pNext; pCut; pCut = pCut->pNext )
             Map_TruthsCut( pMan, pCut );
        Extra_ProgressBarUpdate( pProgress, i, "Tables ..." );
    }
    Extra_ProgressBarStop( pProgress );
}